

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

BOOL __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
ProtectAllocationWithExecuteReadOnly
          (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          Allocation *allocation,char *addressInPage)

{
  BOOL BVar1;
  DWORD protectFlags;
  char *addressInPage_local;
  Allocation *allocation_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  GlobalSecurityPolicy::IsCFGEnabled();
  BVar1 = ProtectAllocation(this,allocation,0x20,0x40,addressInPage);
  return BVar1;
}

Assistant:

BOOL Heap<TAlloc, TPreReservedAlloc>::ProtectAllocationWithExecuteReadOnly(__in Allocation *allocation, __in_opt char* addressInPage)
{
    DWORD protectFlags = 0;
    if (GlobalSecurityPolicy::IsCFGEnabled())
    {
        protectFlags = PAGE_EXECUTE_RO_TARGETS_NO_UPDATE;
    }
    else
    {
        protectFlags = PAGE_EXECUTE_READ;
    }
    #if defined(__APPLE__) && defined(_M_ARM64)
    return this->ProtectAllocation(allocation, protectFlags, PAGE_READWRITE, addressInPage); // PAGE_EXECUTE_READWRITE banned on Apple Silicon
    #else
    return this->ProtectAllocation(allocation, protectFlags, PAGE_EXECUTE_READWRITE, addressInPage);
    #endif
}